

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.cpp
# Opt level: O1

DateTime * FIX::DateTime::nowLocal(void)

{
  DateTime *in_RDI;
  timeval tv;
  tm tm;
  time_t local_68;
  timeval local_60;
  tm local_50;
  
  gettimeofday(&local_60,(__timezone_ptr_t)0x0);
  local_68 = local_60.tv_sec;
  time_localtime(&local_50,&local_68);
  fromTm(in_RDI,&local_50,(int)local_60.tv_usec,6);
  return in_RDI;
}

Assistant:

DateTime DateTime::nowLocal()
{
#if defined( _POSIX_SOURCE ) || defined(HAVE_GETTIMEOFDAY)
    struct timeval tv;
    gettimeofday (&tv, 0);
    return fromLocalTimeT( tv.tv_sec, tv.tv_usec, 6 );
#elif defined( HAVE_FTIME )
    timeb tb;
    ftime (&tb);
    return fromLocalTimeT( tb.time, tb.millitm );
#else
    return fromLocalTimeT( ::time (0), 0 );
#endif
}